

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  char *__src;
  ulong uVar2;
  uint uVar3;
  ptrdiff_t _Num;
  size_t __n;
  scoped_padder p;
  scoped_padder local_70;
  format_int local_48;
  
  uVar2 = msg->thread_id | 1;
  lVar1 = 0x3f;
  if (uVar2 != 0) {
    for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar3 = ((uint)lVar1 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  scoped_padder::scoped_padder
            (&local_70,
             (ulong)((uVar3 + 1) -
                    (uint)(msg->thread_id <
                          *(ulong *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_64 +
                                    (ulong)uVar3 * 8))),&(this->super_flag_formatter).padinfo_,dest)
  ;
  __src = fmt::v6::format_int::format_decimal(&local_48,msg->thread_id);
  __n = (long)(local_48.buffer_ + 0x15) - (long)__src;
  uVar2 = (dest->super_buffer<char>).size_ + __n;
  local_48.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar2) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar2);
  }
  if (local_48.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
  }
  (dest->super_buffer<char>).size_ = uVar2;
  scoped_padder::~scoped_padder(&local_70);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = fmt_helper::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }